

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_model.c
# Opt level: O0

void PrintSolution_C(CAPIExample *pex,char *stub)

{
  undefined8 in_RSI;
  long in_RDI;
  int i_1;
  int i;
  int local_18;
  int local_14;
  
  printf("\n     ********** SOLUTION (%s.sol) ***********\n",in_RSI);
  printf("%s\n","DUALS.");
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 8); local_14 = local_14 + 1) {
    printf("   %10s = %.17g\n",*(undefined8 *)(*(long *)(in_RDI + 0xa0) + (long)local_14 * 8),
           *(undefined8 *)(*(long *)(in_RDI + 0x38) + (long)local_14 * 8));
  }
  printf("%s\n","PRIMALS.");
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 8); local_18 = local_18 + 1) {
    printf("      %7s = %.17g\n",*(undefined8 *)(*(long *)(in_RDI + 0xa8) + (long)local_18 * 8),
           *(undefined8 *)(*(long *)(in_RDI + 0x20) + (long)local_18 * 8));
  }
  printf("\nObjno used: %d, solve_result_num: %d\n",(ulong)(*(int *)(in_RDI + 0xb0) + 1),
         (ulong)*(uint *)(in_RDI + 0xb4));
  return;
}

Assistant:

void PrintSolution_C(CAPIExample* pex, const char* stub) {
  printf(
        "\n     ********** SOLUTION (%s.sol) ***********\n",
        stub);
  printf("%s\n", "DUALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("   %10s = %.17g\n",
           pex->con_name[i], pex->sol_dual_[i]);
  printf("%s\n", "PRIMALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("      %7s = %.17g\n",
           pex->var_name[i], pex->sol_primal_[i]);

  printf("\nObjno used: %d, solve_result_num: %d\n",
         pex->objno_+1, pex->solve_code_);
}